

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall
nuraft::asio_rpc_client::handle_handshake
          (asio_rpc_client *this,ptr<req_msg> *req,rpc_handler *when_done,uint64_t send_timeout_ms,
          error_code *err)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int32 iVar4;
  int iVar5;
  element_type *peVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  element_type *peVar10;
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  *this_00;
  error_code *this_01;
  shared_ptr<nuraft::req_msg> *args_1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  error_code *in_R8;
  ptr<rpc_exception> except;
  ptr<resp_msg> resp;
  ptr<asio_rpc_client> self;
  enable_shared_from_this<nuraft::asio_rpc_client> *in_stack_fffffffffffffe28;
  undefined1 __i;
  atomic<bool> *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  error_code *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  uint in_stack_fffffffffffffe64;
  string local_160 [32];
  strfmt<100> local_140;
  shared_ptr<nuraft::req_msg> *local_d0;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [64];
  error_code *local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::enable_shared_from_this<nuraft::asio_rpc_client>::shared_from_this(in_stack_fffffffffffffe28)
  ;
  __i = (undefined1)((ulong)in_stack_fffffffffffffe28 >> 0x38);
  bVar1 = std::error_code::operator_cast_to_bool(local_28);
  if (bVar1) {
    std::atomic<bool>::operator=(in_stack_fffffffffffffe30,(bool)__i);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x62));
    if (bVar1) {
      peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x27354c);
      iVar5 = (*peVar6->_vptr_logger[7])();
      if (1 < iVar5) {
        peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x27357c);
        peVar10 = std::
                  __shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x27358e);
        in_stack_fffffffffffffe64 = msg_base::get_dst(&peVar10->super_msg_base);
        uVar7 = std::__cxx11::string::c_str();
        uVar8 = std::__cxx11::string::c_str();
        uVar3 = std::error_code::value(local_28);
        std::error_code::message_abi_cxx11_(in_stack_fffffffffffffe48);
        uVar9 = std::__cxx11::string::c_str();
        msg_if_given_abi_cxx11_
                  ((char *)local_88,"failed SSL handshake with peer %d, %s:%s, error %d, %s",
                   (ulong)in_stack_fffffffffffffe64,uVar7,uVar8,(ulong)uVar3,uVar9);
        (*peVar6->_vptr_logger[8])
                  (peVar6,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"handle_handshake",0x558,local_88);
        iVar2 = (int)((ulong)peVar6 >> 0x20);
        std::__cxx11::string::~string(local_88);
        std::__cxx11::string::~string(local_a8);
      }
    }
    std::shared_ptr<nuraft::resp_msg>::shared_ptr((shared_ptr<nuraft::resp_msg> *)0x2736d2);
    strfmt<100>::strfmt(&local_140,"failed SSL handshake with peer %d, %s:%s, error %d, %s");
    peVar10 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2736f5);
    iVar4 = msg_base::get_dst(&peVar10->super_msg_base);
    this_00 = (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
               *)std::__cxx11::string::c_str();
    this_01 = (error_code *)std::__cxx11::string::c_str();
    iVar5 = std::error_code::value(local_28);
    std::error_code::message_abi_cxx11_(this_01);
    std::__cxx11::string::c_str();
    args_1 = (shared_ptr<nuraft::req_msg> *)
             strfmt<100>::fmt<int,char_const*,char_const*,int,char_const*>
                       ((strfmt<100> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)
                        ,iVar2,(char *)CONCAT44(iVar5,in_stack_fffffffffffffe50),(char *)this_01,
                        (int)((ulong)this_00 >> 0x20),
                        (char *)CONCAT44(iVar4,in_stack_fffffffffffffe38));
    local_d0 = args_1;
    cs_new<nuraft::rpc_exception,char_const*,std::shared_ptr<nuraft::req_msg>&>
              ((char **)CONCAT44(iVar4,in_stack_fffffffffffffe38),args_1);
    std::__cxx11::string::~string(local_160);
    std::
    function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
    operator()(this_00,(shared_ptr<nuraft::resp_msg> *)CONCAT44(iVar4,in_stack_fffffffffffffe38),
               (shared_ptr<nuraft::rpc_exception> *)args_1);
    std::shared_ptr<nuraft::rpc_exception>::~shared_ptr
              ((shared_ptr<nuraft::rpc_exception> *)0x2737e8);
    std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x2737f5);
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x62));
    if (bVar1) {
      peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2733cd);
      iVar2 = (*peVar6->_vptr_logger[7])();
      if (3 < iVar2) {
        peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2733fd);
        uVar7 = std::__cxx11::string::c_str();
        uVar8 = std::__cxx11::string::c_str();
        msg_if_given_abi_cxx11_
                  ((char *)local_68,"handshake with %s:%s succeeded (as a client)",uVar7,uVar8);
        (*peVar6->_vptr_logger[8])
                  (peVar6,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"handle_handshake",0x550,local_68);
        std::__cxx11::string::~string(local_68);
      }
    }
    std::atomic<bool>::operator=(in_stack_fffffffffffffe30,(bool)__i);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_10,local_18,local_20);
  }
  std::shared_ptr<nuraft::asio_rpc_client>::~shared_ptr
            ((shared_ptr<nuraft::asio_rpc_client> *)0x27386a);
  return;
}

Assistant:

void handle_handshake(ptr<req_msg>& req,
                          rpc_handler& when_done,
                          uint64_t send_timeout_ms,
                          const ERROR_CODE& err)
    {
        ptr<asio_rpc_client> self = this->shared_from_this();

        if (!err) {
            p_in( "handshake with %s:%s succeeded (as a client)",
                  host_.c_str(), port_.c_str() );
            ssl_ready_ = true;
            this->send(req, when_done, send_timeout_ms);

        } else {
            abandoned_ = true;
            p_er( "failed SSL handshake with peer %d, %s:%s, error %d, %s",
                  req->get_dst(), host_.c_str(), port_.c_str(), err.value(),
                  err.message().c_str() );

            // Immediately stop.
            ptr<resp_msg> resp;
            ptr<rpc_exception> except
                ( cs_new<rpc_exception>
                  ( sstrfmt("failed SSL handshake with peer %d, %s:%s, "
                            "error %d, %s")
                           .fmt( req->get_dst(), host_.c_str(),
                                 port_.c_str(), err.value(), err.message().c_str() ),
                    req ) );
            when_done(resp, except);
        }
    }